

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

bool_t ValidateSizeSegUID(ebml_binary *p)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [11];
  undefined1 auVar5 [12];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  bool_t bVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  char cStack_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  uint8_t test [16];
  ebml_binary *p_local;
  
  if (((p->Base).DataSize != 0x10) ||
     (test._8_8_ = p, bVar8 = EBML_ElementIsFiniteSize(&p->Base), bVar8 == 0)) {
    return 0;
  }
  if (*(char *)(test._8_8_ + 0x65) == '\0') {
    return 1;
  }
  memset(&cStack_28,0,0x10);
  if (test._8_8_ != -0x68) {
    pcVar1 = *(char **)(test._8_8_ + 0x68);
    cVar9 = -(pcVar1[2] == cStack_26);
    cVar10 = -(pcVar1[3] == cStack_25);
    cVar11 = -(pcVar1[4] == cStack_24);
    cVar12 = -(pcVar1[5] == cStack_23);
    cVar13 = -(pcVar1[6] == cStack_22);
    cVar14 = -(pcVar1[7] == cStack_21);
    cVar15 = -(pcVar1[8] == test[0]);
    cVar16 = -(pcVar1[9] == test[1]);
    cVar17 = -(pcVar1[10] == test[2]);
    cVar18 = -(pcVar1[0xb] == test[3]);
    cVar19 = -(pcVar1[0xc] == test[4]);
    cVar20 = -(pcVar1[0xd] == test[5]);
    cVar21 = -(pcVar1[0xe] == test[6]);
    bVar22 = -(pcVar1[0xf] == test[7]);
    auVar2[1] = -(pcVar1[1] == cStack_27);
    auVar2[0] = -(*pcVar1 == cStack_28);
    auVar2[2] = cVar9;
    auVar2[3] = cVar10;
    auVar2[4] = cVar11;
    auVar2[5] = cVar12;
    auVar2[6] = cVar13;
    auVar2[7] = cVar14;
    auVar2[8] = cVar15;
    auVar2[9] = cVar16;
    auVar2[10] = cVar17;
    auVar2[0xb] = cVar18;
    auVar2[0xc] = cVar19;
    auVar2[0xd] = cVar20;
    auVar2[0xe] = cVar21;
    auVar2[0xf] = bVar22;
    auVar3[1] = -(pcVar1[1] == cStack_27);
    auVar3[0] = -(*pcVar1 == cStack_28);
    auVar3[2] = cVar9;
    auVar3[3] = cVar10;
    auVar3[4] = cVar11;
    auVar3[5] = cVar12;
    auVar3[6] = cVar13;
    auVar3[7] = cVar14;
    auVar3[8] = cVar15;
    auVar3[9] = cVar16;
    auVar3[10] = cVar17;
    auVar3[0xb] = cVar18;
    auVar3[0xc] = cVar19;
    auVar3[0xd] = cVar20;
    auVar3[0xe] = cVar21;
    auVar3[0xf] = bVar22;
    auVar7[1] = cVar10;
    auVar7[0] = cVar9;
    auVar7[2] = cVar11;
    auVar7[3] = cVar12;
    auVar7[4] = cVar13;
    auVar7[5] = cVar14;
    auVar7[6] = cVar15;
    auVar7[7] = cVar16;
    auVar7[8] = cVar17;
    auVar7[9] = cVar18;
    auVar7[10] = cVar19;
    auVar7[0xb] = cVar20;
    auVar7[0xc] = cVar21;
    auVar7[0xd] = bVar22;
    auVar6[1] = cVar11;
    auVar6[0] = cVar10;
    auVar6[2] = cVar12;
    auVar6[3] = cVar13;
    auVar6[4] = cVar14;
    auVar6[5] = cVar15;
    auVar6[6] = cVar16;
    auVar6[7] = cVar17;
    auVar6[8] = cVar18;
    auVar6[9] = cVar19;
    auVar6[10] = cVar20;
    auVar6[0xb] = cVar21;
    auVar6[0xc] = bVar22;
    auVar5[1] = cVar12;
    auVar5[0] = cVar11;
    auVar5[2] = cVar13;
    auVar5[3] = cVar14;
    auVar5[4] = cVar15;
    auVar5[5] = cVar16;
    auVar5[6] = cVar17;
    auVar5[7] = cVar18;
    auVar5[8] = cVar19;
    auVar5[9] = cVar20;
    auVar5[10] = cVar21;
    auVar5[0xb] = bVar22;
    auVar4[1] = cVar13;
    auVar4[0] = cVar12;
    auVar4[2] = cVar14;
    auVar4[3] = cVar15;
    auVar4[4] = cVar16;
    auVar4[5] = cVar17;
    auVar4[6] = cVar18;
    auVar4[7] = cVar19;
    auVar4[8] = cVar20;
    auVar4[9] = cVar21;
    auVar4[10] = bVar22;
    return (long)(int)(uint)((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB141(auVar7 >> 7,0) & 1) << 2 |
                                      (ushort)(SUB131(auVar6 >> 7,0) & 1) << 3 |
                                      (ushort)(SUB121(auVar5 >> 7,0) & 1) << 4 |
                                      (ushort)(SUB111(auVar4 >> 7,0) & 1) << 5 |
                                      (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(
                                                  cVar20,CONCAT16(cVar19,CONCAT15(cVar18,CONCAT14(
                                                  cVar17,CONCAT13(cVar16,CONCAT12(cVar15,CONCAT11(
                                                  cVar14,cVar13))))))))) >> 7) & 1) << 6 |
                                      (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(
                                                  cVar20,CONCAT15(cVar19,CONCAT14(cVar18,CONCAT13(
                                                  cVar17,CONCAT12(cVar16,CONCAT11(cVar15,cVar14)))))
                                                  ))) >> 7) & 1) << 7 | (ushort)(bVar22 >> 7) << 0xf
                                     ) != 0xffff);
  }
  __assert_fail("&(p->Data)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x8a2,"bool_t ValidateSizeSegUID(const ebml_binary *)");
}

Assistant:

static bool_t ValidateSizeSegUID(const ebml_binary *p)
{
    uint8_t test[16];
    if (p->Base.DataSize != 16 || !EBML_ElementIsFiniteSize((const ebml_element *)p))
        return 0;
    if (!p->Base.bValueIsSet)
        return 1;
    memset(test,0,sizeof(test));
    return memcmp(ARRAYBEGIN(p->Data,uint8_t),test,16)!=0; // make sure the value is not 0
}